

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O0

void __thiscall
icu_63::StringCharacterIterator::StringCharacterIterator
          (StringCharacterIterator *this,UnicodeString *textStr,int32_t textBegin,int32_t textEnd,
          int32_t textPos)

{
  int32_t length;
  char16_t *pcVar1;
  ConstChar16Ptr local_30;
  int32_t local_24;
  int32_t local_20;
  int32_t textPos_local;
  int32_t textEnd_local;
  int32_t textBegin_local;
  UnicodeString *textStr_local;
  StringCharacterIterator *this_local;
  
  local_24 = textPos;
  local_20 = textEnd;
  textPos_local = textBegin;
  _textEnd_local = textStr;
  textStr_local = (UnicodeString *)this;
  pcVar1 = UnicodeString::getBuffer(textStr);
  ConstChar16Ptr::ConstChar16Ptr(&local_30,pcVar1);
  length = UnicodeString::length(_textEnd_local);
  UCharCharacterIterator::UCharCharacterIterator
            (&this->super_UCharCharacterIterator,&local_30,length,textPos_local,local_20,local_24);
  ConstChar16Ptr::~ConstChar16Ptr(&local_30);
  (this->super_UCharCharacterIterator).super_CharacterIterator.super_ForwardCharacterIterator.
  super_UObject._vptr_UObject = (_func_int **)&PTR__StringCharacterIterator_004a2e90;
  UnicodeString::UnicodeString(&this->text,_textEnd_local);
  pcVar1 = UnicodeString::getBuffer(&this->text);
  (this->super_UCharCharacterIterator).text = pcVar1;
  return;
}

Assistant:

StringCharacterIterator::StringCharacterIterator(const UnicodeString& textStr,
                                                 int32_t textBegin,
                                                 int32_t textEnd,
                                                 int32_t textPos)
  : UCharCharacterIterator(textStr.getBuffer(), textStr.length(), textBegin, textEnd, textPos),
    text(textStr)
{
    // we had set the input parameter's array, now we need to set our copy's array
    UCharCharacterIterator::text = this->text.getBuffer();
}